

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__zbuild_huffman(stbi__zhuffman *z,stbi_uc *sizelist,int num)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  int in_EDX;
  long in_RSI;
  void *in_RDI;
  int j;
  stbi__uint16 fastv;
  int c;
  int s;
  int sizes [17];
  int next_code [16];
  int code;
  int k;
  int i;
  int local_c8;
  int local_b8 [20];
  int aiStack_68 [16];
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  void *local_10;
  
  local_24 = 0;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_b8,0,0x44);
  memset(local_10,0,0x400);
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    local_b8[*(byte *)(local_18 + local_20)] = local_b8[*(byte *)(local_18 + local_20)] + 1;
  }
  local_b8[0] = 0;
  for (local_20 = 1; local_20 < 0x10; local_20 = local_20 + 1) {
    if (1 << ((byte)local_20 & 0x1f) < local_b8[local_20]) {
      iVar3 = stbi__err("bad sizes");
      return iVar3;
    }
  }
  local_28 = 0;
  local_20 = 1;
  while( true ) {
    if (0xf < local_20) {
      *(undefined4 *)((long)local_10 + 0x460) = 0x10000;
      for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
        bVar1 = *(byte *)(local_18 + local_20);
        uVar4 = (uint)bVar1;
        if (uVar4 != 0) {
          iVar3 = (aiStack_68[(int)uVar4] -
                  (uint)*(ushort *)((long)local_10 + (long)(int)uVar4 * 2 + 0x400)) +
                  (uint)*(ushort *)((long)local_10 + (long)(int)uVar4 * 2 + 0x464);
          uVar2 = (ushort)local_20;
          *(byte *)((long)local_10 + (long)iVar3 + 0x484) = bVar1;
          *(ushort *)((long)local_10 + (long)iVar3 * 2 + 0x5a4) = uVar2;
          if (uVar4 < 10) {
            for (local_c8 = stbi__bit_reverse(0,0x1a4fb1); local_c8 < 0x200;
                local_c8 = (1 << (bVar1 & 0x1f)) + local_c8) {
              *(ushort *)((long)local_10 + (long)local_c8 * 2) = (ushort)bVar1 << 9 | uVar2;
            }
          }
          aiStack_68[(int)uVar4] = aiStack_68[(int)uVar4] + 1;
        }
      }
      return 1;
    }
    aiStack_68[local_20] = local_28;
    *(short *)((long)local_10 + (long)local_20 * 2 + 0x400) = (short)local_28;
    *(short *)((long)local_10 + (long)local_20 * 2 + 0x464) = (short)local_24;
    local_28 = local_28 + local_b8[local_20];
    if ((local_b8[local_20] != 0) && (1 << ((byte)local_20 & 0x1f) <= local_28 + -1)) break;
    *(int *)((long)local_10 + (long)local_20 * 4 + 0x420) =
         local_28 << (0x10 - (byte)local_20 & 0x1f);
    local_28 = local_28 * 2;
    local_24 = local_b8[local_20] + local_24;
    local_20 = local_20 + 1;
  }
  iVar3 = stbi__err("bad codelengths");
  return iVar3;
}

Assistant:

static int stbi__zbuild_huffman(stbi__zhuffman *z, const stbi_uc *sizelist, int num)
{
   int i,k=0;
   int code, next_code[16], sizes[17];

   // DEFLATE spec for generating codes
   memset(sizes, 0, sizeof(sizes));
   memset(z->fast, 0, sizeof(z->fast));
   for (i=0; i < num; ++i)
      ++sizes[sizelist[i]];
   sizes[0] = 0;
   for (i=1; i < 16; ++i)
      if (sizes[i] > (1 << i))
         return stbi__err("bad sizes", "Corrupt PNG");
   code = 0;
   for (i=1; i < 16; ++i) {
      next_code[i] = code;
      z->firstcode[i] = (stbi__uint16) code;
      z->firstsymbol[i] = (stbi__uint16) k;
      code = (code + sizes[i]);
      if (sizes[i])
         if (code-1 >= (1 << i)) return stbi__err("bad codelengths","Corrupt PNG");
      z->maxcode[i] = code << (16-i); // preshift for inner loop
      code <<= 1;
      k += sizes[i];
   }
   z->maxcode[16] = 0x10000; // sentinel
   for (i=0; i < num; ++i) {
      int s = sizelist[i];
      if (s) {
         int c = next_code[s] - z->firstcode[s] + z->firstsymbol[s];
         stbi__uint16 fastv = (stbi__uint16) ((s << 9) | i);
         z->size [c] = (stbi_uc     ) s;
         z->value[c] = (stbi__uint16) i;
         if (s <= STBI__ZFAST_BITS) {
            int j = stbi__bit_reverse(next_code[s],s);
            while (j < (1 << STBI__ZFAST_BITS)) {
               z->fast[j] = fastv;
               j += (1 << s);
            }
         }
         ++next_code[s];
      }
   }
   return 1;
}